

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  char *pcVar1;
  byte bVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  char_t *s;
  char_t *pcVar5;
  char_t *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  char cVar11;
  bool bVar12;
  
  pcVar6 = value + -1;
  do {
    pcVar5 = pcVar6;
    bVar2 = pcVar5[1];
    pcVar6 = pcVar5 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
  uVar8 = (ulong)((bVar2 - 0x2b & 0xfd) == 0);
  pcVar7 = pcVar6 + uVar8;
  if ((pcVar6[uVar8] == '0') && ((pcVar5[uVar8 + 2] & 0xdfU) == 0x58)) {
    pcVar7 = pcVar6 + uVar8 + 2;
    do {
      cVar9 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar9 == '0');
    uVar8 = 0;
    uVar4 = 0;
    do {
      uVar10 = (int)cVar9 - 0x30;
      if (uVar10 < 10) {
        uVar4 = uVar4 << 4 | (ulong)uVar10;
      }
      else {
        uVar10 = (int)cVar9 | 0x20;
        if (5 < uVar10 - 0x61) goto LAB_001199e2;
        uVar4 = uVar4 * 0x10 + (ulong)(uVar10 - 0x57);
      }
      cVar9 = *pcVar7;
      uVar8 = uVar8 + 1;
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  do {
    cVar9 = *pcVar7;
    pcVar7 = pcVar7 + 1;
  } while (cVar9 == '0');
  uVar8 = 0;
  uVar4 = 0;
  cVar11 = cVar9;
  while ((int)cVar11 - 0x30U < 10) {
    uVar4 = (ulong)((int)cVar11 - 0x30U) + uVar4 * 10;
    pcVar1 = pcVar7 + uVar8;
    uVar8 = uVar8 + 1;
    cVar11 = *pcVar1;
  }
  if (0x13 < uVar8) {
    bVar12 = true;
    if (uVar8 != 0x14) goto LAB_001199fa;
    if ('0' < cVar9) {
      bVar12 = -1 < (long)uVar4 || cVar9 != '1';
      goto LAB_001199fa;
    }
  }
  bVar12 = false;
LAB_001199fa:
  if (bVar2 == 0x2d) {
    uVar3 = -uVar4;
    if (-minv < uVar4) {
      uVar3 = minv;
    }
    if (bVar12) {
      uVar3 = minv;
    }
    return uVar3;
  }
  if (maxv <= uVar4) {
    uVar4 = maxv;
  }
  if (bVar12) {
    uVar4 = maxv;
  }
  return uVar4;
LAB_001199e2:
  bVar12 = 0x10 < uVar8;
  goto LAB_001199fa;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}